

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.hpp
# Opt level: O2

ostream * viennamath::operator<<
                    (ostream *stream,rt_expr<viennamath::rt_expression_interface<double>_> *e)

{
  int iVar1;
  ostream *poVar2;
  string local_40 [32];
  
  iVar1 = (*((e->rt_expr_)._M_ptr)->_vptr_rt_expression_interface[7])();
  poVar2 = std::operator<<(stream,"expr");
  if ((char)iVar1 == '\0') {
    (*((e->rt_expr_)._M_ptr)->_vptr_rt_expression_interface[3])(local_40);
    std::operator<<(poVar2,local_40);
  }
  else {
    poVar2 = std::operator<<(poVar2,"(");
    (*((e->rt_expr_)._M_ptr)->_vptr_rt_expression_interface[3])(local_40);
    poVar2 = std::operator<<(poVar2,local_40);
    std::operator<<(poVar2,")");
  }
  std::__cxx11::string::~string(local_40);
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream & stream, rt_expr<InterfaceType> const & e)
  {
    if (e.get()->is_unary())
    {
      stream << "expr"
            << "("
            << e.get()->deep_str()
            << ")";
    }
    else
    {
      stream << "expr"
            << e.get()->deep_str();
    }

    return stream;
  }